

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareCompatibleSameSizeButDifferentExponent_Test::TestBody
          (Units_compareCompatibleSameSizeButDifferentExponent_Test *this)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_70;
  AssertionResult local_68;
  long local_58 [2];
  AssertHelper local_48 [8];
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Units::create();
  psVar1 = local_20;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>();
  libcellml::Units::addUnit((StandardUnit)local_20,0,1.0,1.0,(string *)0x0);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_30;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>();
  libcellml::Units::addUnit((StandardUnit)local_30,0,2.0,1.0,(string *)0x0);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  bVar2 = libcellml::Units::compatible((shared_ptr *)&local_20,(shared_ptr *)&local_30);
  local_40[0] = bVar2 ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)local_40,"libcellml::Units::compatible(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7b3,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((long *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = libcellml::Units::compatible((shared_ptr *)&local_30,(shared_ptr *)&local_20);
  local_40[0] = bVar2 ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)local_40,"libcellml::Units::compatible(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7b4,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((long *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, compareCompatibleSameSizeButDifferentExponent)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 2.0, 1.0);

    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}